

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_nreverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  
  if (ls == (sexp)&DAT_0000023e) {
    return (sexp)&DAT_0000023e;
  }
  if ((((ulong)ls & 3) == 0) && (ls->tag == 6)) {
    psVar3 = (sexp)&DAT_0000023e;
    do {
      psVar2 = ls;
      psVar1 = (ls->value).type.cpl;
      (ls->value).type.cpl = psVar3;
      if (((ulong)psVar1 & 3) != 0) {
        return psVar2;
      }
      psVar3 = ls;
      ls = psVar1;
    } while (psVar1->tag == 6);
    return psVar2;
  }
  psVar3 = sexp_type_exception(ctx,self,6,ls);
  return psVar3;
}

Assistant:

sexp sexp_nreverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp a, b, tmp;
  if (ls == SEXP_NULL) return ls;
  sexp_assert_type(ctx, sexp_pairp, SEXP_PAIR, ls);
  b = ls;
  a = sexp_cdr(ls);
  sexp_cdr(b) = SEXP_NULL;
  for ( ; sexp_pairp(a); b=a, a=tmp) {
    tmp = sexp_cdr(a);
    sexp_cdr(a) = b;
  }
  return b;
}